

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_event.h
# Opt level: O2

type __thiscall
miniros::MessageEvent<rosgraph_msgs::Clock_<std::allocator<void>>const>::
copyMessageIfNecessary<rosgraph_msgs::Clock_<std::allocator<void>>const>
          (MessageEvent<rosgraph_msgs::Clock_<std::allocator<void>>const> *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  type tVar2;
  shared_ptr<const_rosgraph_msgs::Clock_<std::allocator<void>_>_> local_18;
  
  std::
  const_pointer_cast<rosgraph_msgs::Clock_<std::allocator<void>>,rosgraph_msgs::Clock_<std::allocator<void>>const>
            (&local_18);
  _Var1._M_pi = local_18.
                super___shared_ptr<const_rosgraph_msgs::Clock_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  local_18.
  super___shared_ptr<const_rosgraph_msgs::Clock_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(element_type **)this =
       local_18.
       super___shared_ptr<const_rosgraph_msgs::Clock_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var1._M_pi;
  local_18.
  super___shared_ptr<const_rosgraph_msgs::Clock_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_18.
              super___shared_ptr<const_rosgraph_msgs::Clock_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  tVar2.
  super___shared_ptr<const_rosgraph_msgs::Clock_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  tVar2.
  super___shared_ptr<const_rosgraph_msgs::Clock_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (type)tVar2.
               super___shared_ptr<const_rosgraph_msgs::Clock_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

typename std::enable_if<!std::is_void<M2>::value, std::shared_ptr<M> >::type copyMessageIfNecessary() const
  {
    if (std::is_const<M>::value || !nonconst_need_copy_)
    {
      return std::const_pointer_cast<Message>(message_);
    }

    if (message_copy_)
    {
      return message_copy_;
    }

    assert(create_);
    message_copy_ = create_();
    *message_copy_ = *message_;

    return message_copy_;
  }